

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDComponentList::Internal_Create
          (ON_SubDComponentList *this,ON_SubD *subd,bool bAddVertices,bool bAddEdges,bool bAddFaces,
          bool bComponentInListMark,uint marked_component_count)

{
  ON_SubD *this_00;
  ON_SimpleArray<ON_SubDComponentPtr> *this_01;
  element_type *peVar1;
  ON_SubDimple *pOVar2;
  bool bVar3;
  uint uVar4;
  ON_SubDLevel *pOVar5;
  ON_SubDVertex *pOVar6;
  ON__UINT64 OVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ON_SubDVertexIterator vit;
  ON_SubDComponentPtr local_80;
  ulong local_78;
  ON_SubD *local_70;
  ON_SubDEdgeIterator local_68;
  
  local_78 = CONCAT44(local_78._4_4_,(int)CONCAT71(in_register_00000011,bAddVertices));
  this->m_subd_runtime_serial_number = 0;
  this->m_subd_geometry_content_serial_number = 0;
  this->m_subd_render_content_serial_number = 0;
  if (-1 < (this->m_component_list).m_capacity) {
    (this->m_component_list).m_count = 0;
  }
  this_00 = &this->m_subd;
  ON_SubD::ShareDimple(this_00,&ON_SubD::Empty);
  if (marked_component_count == 0) {
    uVar4 = 0;
  }
  else {
    uVar10 = 0;
    uVar8 = 0;
    if (bAddFaces) {
      peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar5 = peVar1->m_active_level, pOVar5 == (ON_SubDLevel *)0x0)) {
        pOVar5 = &ON_SubDLevel::Empty;
      }
      uVar8 = (ulong)pOVar5->m_face_count;
    }
    if (bAddEdges) {
      peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar5 = peVar1->m_active_level, pOVar5 == (ON_SubDLevel *)0x0)) {
        pOVar5 = &ON_SubDLevel::Empty;
      }
      uVar10 = pOVar5->m_edge_count;
    }
    uVar9 = 0;
    if ((char)local_78 != '\0') {
      peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar5 = peVar1->m_active_level, pOVar5 == (ON_SubDLevel *)0x0)) {
        pOVar5 = &ON_SubDLevel::Empty;
      }
      uVar9 = pOVar5->m_vertex_count;
    }
    uVar4 = 0;
    if (((uVar10 != 0 || (int)uVar8 != 0) || uVar9 != 0) &&
       (uVar4 = 0, marked_component_count <= uVar10 + (int)uVar8 + uVar9)) {
      this_01 = &this->m_component_list;
      local_78 = uVar8;
      local_70 = this_00;
      if ((ulong)(long)(this->m_component_list).m_capacity < (ulong)marked_component_count) {
        ON_SimpleArray<ON_SubDComponentPtr>::SetCapacity(this_01,(ulong)marked_component_count);
      }
      if (-1 < (this->m_component_list).m_capacity) {
        (this->m_component_list).m_count = 0;
      }
      if (uVar9 != 0) {
        ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&local_68,subd);
        local_68.m_edge_index = 0;
        local_68.m_e_current = local_68.m_e_first;
        if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
          pOVar6 = (ON_SubDVertex *)local_68.m_e_first;
          do {
            bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar6->super_ON_SubDComponentBase).m_status);
            if (bVar3 == bComponentInListMark) {
              local_80.m_ptr = (ulong)pOVar6 | 2;
              ON_SimpleArray<ON_SubDComponentPtr>::Append(this_01,&local_80);
            }
            pOVar6 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&local_68);
          } while (pOVar6 != (ON_SubDVertex *)0x0);
        }
        ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
      }
      if (uVar10 != 0) {
        ON_SubDEdgeIterator::ON_SubDEdgeIterator(&local_68,subd);
        local_68.m_edge_index = 0;
        local_68.m_e_current = local_68.m_e_first;
        if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
          pOVar6 = (ON_SubDVertex *)local_68.m_e_first;
          do {
            bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar6->super_ON_SubDComponentBase).m_status);
            if (bVar3 == bComponentInListMark) {
              local_80.m_ptr = (ulong)pOVar6 | 4;
              ON_SimpleArray<ON_SubDComponentPtr>::Append(this_01,&local_80);
            }
            pOVar6 = (ON_SubDVertex *)ON_SubDEdgeIterator::NextEdge(&local_68);
          } while (pOVar6 != (ON_SubDVertex *)0x0);
        }
        ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
      }
      if ((int)local_78 != 0) {
        ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&local_68,subd);
        local_68.m_edge_index = 0;
        local_68.m_e_current = local_68.m_e_first;
        if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
          pOVar6 = (ON_SubDVertex *)local_68.m_e_first;
          do {
            bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar6->super_ON_SubDComponentBase).m_status);
            if (bVar3 == bComponentInListMark) {
              local_80.m_ptr = (ulong)pOVar6 | 6;
              ON_SimpleArray<ON_SubDComponentPtr>::Append(this_01,&local_80);
            }
            pOVar6 = (ON_SubDVertex *)
                     ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&local_68);
          } while (pOVar6 != (ON_SubDVertex *)0x0);
        }
        ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
      }
      if ((this->m_component_list).m_count != 0) {
        ON_SubD::ShareDimple(local_70,subd);
        pOVar2 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (pOVar2 == (ON_SubDimple *)0x0) {
          this->m_subd_runtime_serial_number = 0;
          OVar7 = 0;
        }
        else {
          this->m_subd_runtime_serial_number = pOVar2->RuntimeSerialNumber;
          OVar7 = ON_SubDimple::GeometryContentSerialNumber(pOVar2);
        }
        this->m_subd_geometry_content_serial_number = OVar7;
        pOVar2 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (pOVar2 == (ON_SubDimple *)0x0) {
          OVar7 = 0;
        }
        else {
          OVar7 = ON_SubDimple::RenderContentSerialNumber(pOVar2);
        }
        this->m_subd_render_content_serial_number = OVar7;
      }
      uVar4 = (this->m_component_list).m_count;
    }
  }
  return uVar4;
}

Assistant:

unsigned ON_SubDComponentList::Internal_Create(const ON_SubD & subd, bool bAddVertices, bool bAddEdges, bool bAddFaces, bool bComponentInListMark, unsigned marked_component_count)
{
  Destroy();

  if (0 == marked_component_count)
    return 0;

  const unsigned face_count = bAddFaces ? subd.FaceCount() : 0U;
  const unsigned edge_count = bAddEdges ? subd.EdgeCount() : 0U;
  const unsigned vertex_count = bAddVertices ? subd.VertexCount() : 0U;
  if (0 == vertex_count && 0 == edge_count && 0 == face_count)
    return 0;

  if (marked_component_count > vertex_count + edge_count + face_count)
    return 0;

  bComponentInListMark = bComponentInListMark ? true : false;
  m_component_list.Reserve(marked_component_count);
  m_component_list.SetCount(0);
  if (vertex_count > 0)
  {
    ON_SubDVertexIterator vit(subd);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (bComponentInListMark != v->m_status.RuntimeMark())
        continue;
      m_component_list.Append(v->ComponentPtr());
    }
  }
  if (edge_count > 0)
  {
    ON_SubDEdgeIterator eit(subd);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (bComponentInListMark != e->m_status.RuntimeMark())
        continue;
      m_component_list.Append(e->ComponentPtr());
    }
  }
  if (face_count > 0)
  {
    ON_SubDFaceIterator fit(subd);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (bComponentInListMark != f->m_status.RuntimeMark())
        continue;
      m_component_list.Append(f->ComponentPtr());
    }
  }

  if (m_component_list.UnsignedCount() > 0)
  {
    m_subd.ShareDimple(subd);
    m_subd_runtime_serial_number = subd.RuntimeSerialNumber();
    m_subd_geometry_content_serial_number = subd.GeometryContentSerialNumber();
    m_subd_render_content_serial_number = subd.RenderContentSerialNumber();
  }
  return m_component_list.UnsignedCount();
}